

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void conv_fmt_16to8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                        int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i_src;
  int i_dst;
  uchar *pdst;
  short *psrc;
  int local_30;
  int j;
  int i;
  int src_stride_local;
  int height_local;
  int width_local;
  uchar **dst_local;
  uchar *src_uv_local;
  uchar *src_y_local;
  
  _i_src = *dst;
  iVar1 = *dst_stride;
  pdst = src_y;
  for (local_30 = 0; local_30 < height; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < width; psrc._4_4_ = psrc._4_4_ + 1) {
      _i_src[psrc._4_4_] = (uchar)*(undefined2 *)(pdst + (long)psrc._4_4_ * 2);
    }
    pdst = pdst + (long)(src_stride >> 1) * 2;
    _i_src = _i_src + iVar1;
  }
  iVar2 = width >> ((byte)uv_shift & 0x1f);
  iVar3 = height >> ((byte)uv_shift & 0x1f);
  _i_src = dst[1];
  iVar1 = dst_stride[1];
  pdst = src_uv;
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar2; psrc._4_4_ = psrc._4_4_ + 1) {
      _i_src[psrc._4_4_] = (uchar)*(undefined2 *)(pdst + (long)(psrc._4_4_ << 1) * 2);
    }
    pdst = pdst + (long)(src_stridec >> 1) * 2;
    _i_src = _i_src + iVar1;
  }
  pdst = src_uv + 2;
  _i_src = dst[2];
  iVar1 = dst_stride[2];
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar2; psrc._4_4_ = psrc._4_4_ + 1) {
      _i_src[psrc._4_4_] = (uchar)*(undefined2 *)(pdst + (long)(psrc._4_4_ << 1) * 2);
    }
    pdst = pdst + (long)(src_stridec >> 1) * 2;
    _i_src = _i_src + iVar1;
  }
  return;
}

Assistant:

static void conv_fmt_16to8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    unsigned char* pdst = dst[0];
    int i_dst, i_src;

    i_src = src_stride >> 1;
    i_dst = dst_stride[0];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = dst[2];
    i_dst = dst_stride[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}